

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config-c.cpp
# Opt level: O3

duckdb_state duckdb_create_config(duckdb_config *out_config)

{
  DBConfig *this;
  duckdb_state dVar1;
  string local_80;
  Value local_60;
  
  dVar1 = DuckDBError;
  if (out_config != (duckdb_config *)0x0) {
    *out_config = (duckdb_config)0x0;
    this = (DBConfig *)operator_new(0x6a0);
    duckdb::DBConfig::DBConfig(this);
    *out_config = (duckdb_config)this;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"duckdb_api","");
    duckdb::Value::Value(&local_60,"capi");
    duckdb::DBConfig::SetOptionByName(this,&local_80,&local_60);
    duckdb::Value::~Value(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    dVar1 = DuckDBSuccess;
  }
  return dVar1;
}

Assistant:

duckdb_state duckdb_create_config(duckdb_config *out_config) {
	if (!out_config) {
		return DuckDBError;
	}
	try {
		*out_config = nullptr;
		auto config = new DBConfig();
		*out_config = reinterpret_cast<duckdb_config>(config);
		config->SetOptionByName("duckdb_api", "capi");
	} catch (...) { // LCOV_EXCL_START
		return DuckDBError;
	} // LCOV_EXCL_STOP
	return DuckDBSuccess;
}